

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

uint32_t utf8_charbytes(char *s,uint32_t i)

{
  byte bVar1;
  uchar c;
  uint32_t i_local;
  char *s_local;
  
  bVar1 = s[i];
  if ((bVar1 == 0) || (0x7f < bVar1)) {
    if ((bVar1 < 0xc2) || (0xdf < bVar1)) {
      if ((bVar1 < 0xe0) || (0xef < bVar1)) {
        if ((bVar1 < 0xf0) || (0xf4 < bVar1)) {
          s_local._4_4_ = 0;
        }
        else {
          s_local._4_4_ = 4;
        }
      }
      else {
        s_local._4_4_ = 3;
      }
    }
    else {
      s_local._4_4_ = 2;
    }
  }
  else {
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

inline uint32_t utf8_charbytes (const char *s, uint32_t i) {
    unsigned char c = (unsigned char)s[i];
    
    // determine bytes needed for character, based on RFC 3629
    if ((c > 0) && (c <= 127)) return 1;
    if ((c >= 194) && (c <= 223)) return 2;
    if ((c >= 224) && (c <= 239)) return 3;
    if ((c >= 240) && (c <= 244)) return 4;
    
    // means error
    return 0;
}